

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginTest.cpp
# Opt level: O1

void __thiscall
TEST_PluginTest_DisablesPluginsDontRun_Test::~TEST_PluginTest_DisablesPluginsDontRun_Test
          (TEST_PluginTest_DisablesPluginsDontRun_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST(PluginTest, DisablesPluginsDontRun)
{
    registry->installPlugin(thirdPlugin);
    thirdPlugin->disable();
    genFixture->runAllTests();
    CHECK(!thirdPlugin->isEnabled());
    thirdPlugin->enable();
    genFixture->runAllTests();
    CHECK_EQUAL(2, firstPlugin->preAction);
    CHECK_EQUAL(1, thirdPlugin->preAction);
    CHECK(thirdPlugin->isEnabled());
}